

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

uchar __thiscall bsim::quad_value_bit_vector::to_type<unsigned_char>(quad_value_bit_vector *this)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  quad_value_bit_vector *in_RDI;
  int i;
  uchar exp;
  uchar tmp;
  char cVar4;
  int iVar5;
  undefined4 local_10;
  undefined1 local_a;
  undefined1 local_9;
  
  local_9 = '\0';
  local_a = 1;
  local_10 = 0;
  while( true ) {
    iVar5 = local_10;
    iVar2 = bitLength(in_RDI);
    if (iVar2 <= iVar5) break;
    uVar3 = (uint)local_a;
    get((quad_value_bit_vector *)CONCAT44(iVar5,uVar3),0);
    cVar4 = (char)uVar3;
    uVar1 = quad_value::binary_value((quad_value *)in_RDI);
    local_9 = local_9 + cVar4 * uVar1;
    local_a = local_a << 1;
    local_10 = local_10 + 1;
  }
  return local_9;
}

Assistant:

ConvType to_type() const {
      ConvType tmp = 0;
      ConvType exp = 1;
      for (int i = 0; i < bitLength(); i++) {
        tmp += exp*get(i).binary_value();
        exp *= 2;
      }
      return tmp;
      // ConvType tmp = *(const_cast<ConvType*>((const ConvType*) (&(bits[0]))));
      // //TODO FIXME I am a sketchy hack.
      // ConvType mask = sizeof(ConvType) > bits.size() ? (1<<N)-1 : -1; 
      // return tmp & mask;
    }